

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  undefined1 *puVar1;
  lzx_stream *strm;
  undefined1 uVar2;
  short sVar3;
  wchar_t wVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  undefined4 uVar10;
  bool bVar11;
  uint uVar12;
  ssize_t sVar13;
  ushort uVar14;
  wchar_t wVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  int iVar21;
  void *pvVar22;
  void *pvVar23;
  char *pcVar24;
  ulong uVar25;
  int64_t iVar26;
  byte *pbVar27;
  undefined4 *puVar28;
  void *pvVar29;
  undefined4 uVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  byte bVar36;
  int iVar37;
  void *pvVar38;
  ulong uVar39;
  undefined1 *__dest;
  undefined1 *puVar40;
  uint uVar41;
  uint uVar42;
  wchar_t wVar43;
  uint uVar44;
  long lVar45;
  size_t __n;
  char cVar46;
  uint local_184;
  uint local_164;
  uint local_13c;
  uint local_11c;
  ssize_t bytes_avail;
  ssize_t sStack_c0;
  long local_80;
  int local_74;
  long local_70;
  long local_68;
  long local_60;
  ssize_t *local_58;
  long local_50;
  byte *local_48;
  ssize_t bytes_avail_1;
  long local_38;
  
  pvVar22 = a->format->data;
  wVar15 = cab_next_cfdata(a);
  if (wVar15 < L'\0') {
    *avail = (long)wVar15;
    return (void *)0x0;
  }
  lVar7 = *(long *)((long)pvVar22 + 0x28);
  sVar3 = *(short *)(lVar7 + 6);
  if (sVar3 == 3) {
    pvVar22 = a->format->data;
    lVar7 = *(long *)((long)pvVar22 + 0x38);
    pvVar23 = *(void **)((long)pvVar22 + 0xa0);
    if (pvVar23 == (void *)0x0) {
      *(undefined8 *)((long)pvVar22 + 0xa8) = 0x8000;
      pvVar23 = malloc(0x8000);
      *(void **)((long)pvVar22 + 0xa0) = pvVar23;
      if (pvVar23 == (void *)0x0) goto LAB_0011f6d9;
    }
    uVar25 = (ulong)*(ushort *)(lVar7 + 0xc);
    if (*(ushort *)(lVar7 + 0xc) == *(ushort *)(lVar7 + 8)) {
      uVar14 = *(ushort *)(lVar7 + 0xe);
      *avail = uVar25 - uVar14;
      return (void *)((long)pvVar23 + (ulong)uVar14);
    }
    if (*(char *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) != '\0') {
LAB_0011e381:
      lVar33 = *(long *)((long)pvVar22 + 0x1b8);
      *(undefined4 *)(lVar33 + 0x70) = 0;
      strm = (lzx_stream *)((long)pvVar22 + 0x188);
      *(undefined1 *)(lVar33 + 0x75) = 0;
      *(ulong *)((long)pvVar22 + 0x1b0) = uVar25;
LAB_0011e3a6:
      uVar14 = *(ushort *)(lVar7 + 8);
      lVar33 = uVar14 - uVar25;
      if (lVar33 != 0 && (long)uVar25 <= (long)(ulong)uVar14) {
        *(ulong *)((long)pvVar22 + 0x1a0) = uVar25 + *(long *)((long)pvVar22 + 0xa0);
        *(long *)((long)pvVar22 + 0x1a8) = lVar33;
        pbVar27 = (byte *)__archive_read_ahead(a,1,&bytes_avail_1);
        if (pbVar27 != (byte *)0x0) {
          uVar25 = (ulong)*(ushort *)(lVar7 + 6);
          if ((long)uVar25 < bytes_avail_1) {
            bytes_avail_1 = uVar25;
          }
          sVar13 = bytes_avail_1;
          *(byte **)((long)pvVar22 + 0x188) = pbVar27;
          *(ssize_t *)((long)pvVar22 + 400) = bytes_avail_1;
          *(undefined8 *)((long)pvVar22 + 0x198) = 0;
          piVar8 = *(int **)((long)pvVar22 + 0x1b8);
          uVar42 = piVar8[0x87];
          if (uVar42 == 0) {
            local_48 = pbVar27;
            if (((0 < bytes_avail_1) && (*(char *)((long)piVar8 + 0x75) != '\0')) &&
               (iVar21 = piVar8[0x1c], iVar21 + -0x41 < -0x10)) {
              *(ulong *)(piVar8 + 0x1a) =
                   (ulong)*(byte *)(piVar8 + 0x1d) |
                   (ulong)*pbVar27 << 8 | *(long *)(piVar8 + 0x1a) << 0x10;
              *(byte **)((long)pvVar22 + 0x188) = pbVar27 + 1;
              *(ssize_t *)((long)pvVar22 + 400) = bytes_avail_1 + -1;
              piVar8[0x1c] = iVar21 + 0x10;
              *(undefined1 *)((long)piVar8 + 0x75) = 0;
            }
LAB_0011e4b8:
            if (*piVar8 < 0x12) {
              piVar9 = *(int **)((long)pvVar22 + 0x1b8);
              br = (lzx_br *)(piVar9 + 0x1a);
              iVar21 = *piVar9;
switchD_0011e4e7_default:
              switch(iVar21) {
              case 0:
                iVar21 = piVar9[0x1c];
                if (iVar21 < 1) {
                  wVar15 = lzx_br_fillup(strm,br);
                  iVar21 = piVar9[0x1c];
                  if (iVar21 < 1 && wVar15 == L'\0') {
                    *piVar9 = 0;
                    goto joined_r0x0011f5ad;
                  }
                }
                uVar42 = iVar21 - 1;
                cVar46 = (*(ulong *)(piVar9 + 0x1a) >> ((ulong)uVar42 & 0x3f) & 1) != 0;
                *(char *)(piVar9 + 10) = cVar46;
                piVar9[0x1c] = uVar42;
                break;
              case 1:
                cVar46 = (char)piVar9[10];
                uVar42 = piVar9[0x1c];
                break;
              case 2:
                uVar42 = piVar9[0x1c];
                goto LAB_0011e582;
              case 3:
                iVar21 = piVar9[0x1c];
                goto LAB_0011e5ce;
              case 4:
                uVar42 = piVar9[0x1c];
                goto LAB_0011e821;
              case 5:
              case 6:
              case 7:
                goto switchD_0011e4e7_caseD_5;
              case 8:
                goto switchD_0011e4e7_caseD_8;
              case 9:
                goto switchD_0011e4e7_caseD_9;
              case 10:
                goto switchD_0011e4e7_caseD_a;
              case 0xb:
                goto switchD_0011e4e7_caseD_b;
              case 0xc:
                goto switchD_0011e4e7_caseD_c;
              case 0xd:
                goto switchD_0011e4e7_caseD_d;
              case 0xe:
                goto switchD_0011e4e7_caseD_e;
              case 0xf:
                goto switchD_0011e4e7_caseD_f;
              case 0x10:
                goto switchD_0011e4e7_caseD_10;
              case 0x11:
                goto switchD_0011e4e7_caseD_11;
              default:
                goto switchD_0011e4e7_default;
              }
              if (cVar46 != '\0') {
                if ((int)uVar42 < 0x20) {
                  wVar15 = lzx_br_fillup(strm,br);
                  uVar42 = piVar9[0x1c];
                  if ((int)uVar42 < 0x20 && wVar15 == L'\0') {
                    *piVar9 = 1;
                    goto joined_r0x0011f5ad;
                  }
                }
                cVar46 = (char)uVar42;
                uVar42 = uVar42 - 0x20;
                piVar9[9] = (uint)(*(ulong *)(piVar9 + 0x1a) >> ((byte)uVar42 & 0x3f)) & 0xffff |
                            (int)(*(ulong *)(piVar9 + 0x1a) >> (cVar46 - 0x10U & 0x3f)) << 0x10;
                piVar9[0x1c] = uVar42;
              }
LAB_0011e582:
              if ((int)uVar42 < 3) {
                wVar15 = lzx_br_fillup(strm,br);
                uVar42 = piVar9[0x1c];
                if ((int)uVar42 < 3 && wVar15 == L'\0') {
                  *piVar9 = 2;
                  goto joined_r0x0011f5ad;
                }
              }
              iVar21 = uVar42 - 3;
              bVar36 = (byte)(*(ulong *)(piVar9 + 0x1a) >> ((byte)iVar21 & 0x3f)) & 7;
              *(byte *)((long)piVar9 + 0x29) = bVar36;
              piVar9[0x1c] = iVar21;
              if (2 < (byte)(bVar36 - 1)) goto LAB_0011f5af;
LAB_0011e5ce:
              if (iVar21 < 0x18) {
                wVar15 = lzx_br_fillup(strm,br);
                iVar21 = piVar9[0x1c];
                if (iVar21 < 0x18 && wVar15 == L'\0') {
                  *piVar9 = 3;
                  goto joined_r0x0011f5ad;
                }
              }
              uVar42 = iVar21 - 0x18;
              uVar35 = *(ulong *)(piVar9 + 0x1a) >> ((byte)uVar42 & 0x3f) & 0xffff |
                       (ulong)(((uint)(*(ulong *)(piVar9 + 0x1a) >> ((char)iVar21 - 8U & 0x3f)) &
                               0xff) << 0x10);
              *(ulong *)(piVar9 + 0xc) = uVar35;
              piVar9[0x1c] = uVar42;
              if (uVar35 == 0) goto LAB_0011f5af;
              *(ulong *)(piVar9 + 0xe) = uVar35;
              iVar21 = 0xb;
              if (*(char *)((long)piVar9 + 0x29) != '\x01') {
                if (*(char *)((long)piVar9 + 0x29) == '\x03') {
LAB_0011e821:
                  if ((uVar42 & 0xf) == 0) {
                    if ((int)uVar42 < 0x10) {
                      wVar15 = lzx_br_fillup(strm,br);
                      uVar42 = piVar9[0x1c];
                      if ((int)uVar42 < 0x10 && wVar15 == L'\0') {
                        *piVar9 = 4;
                        goto joined_r0x0011f5ad;
                      }
                    }
                    uVar42 = uVar42 - 0x10;
                  }
                  else {
                    uVar42 = uVar42 & 0xfffffff0;
                  }
                  piVar9[0x1c] = uVar42;
                  piVar9[0x14] = 0;
                  *piVar9 = 5;
                  goto switchD_0011e4e7_caseD_5;
                }
                iVar21 = 10;
              }
              *piVar9 = iVar21;
              goto switchD_0011e4e7_default;
            }
            local_38 = *(long *)((long)pvVar22 + 0x1a8);
            puVar28 = *(undefined4 **)((long)pvVar22 + 0x1b8);
            local_58 = (ssize_t *)(puVar28 + 0x1a);
            bytes_avail = *(ssize_t *)(puVar28 + 0x1a);
            sStack_c0 = *(ssize_t *)(puVar28 + 0x1c);
            local_68 = *(long *)(puVar28 + 0x18);
            puVar1 = *(undefined1 **)((long)pvVar22 + 0x1a0) + local_38;
            lVar33 = *(long *)(puVar28 + 4);
            local_70 = *(long *)(puVar28 + 0x30);
            local_60 = *(long *)(puVar28 + 0x4a);
            local_50 = *(long *)(puVar28 + 100);
            local_80 = (long)(int)puVar28[0x32];
            wVar15 = puVar28[0x4c];
            wVar4 = puVar28[0x66];
            uVar16 = puVar28[8];
            cVar46 = *(char *)((long)puVar28 + 0x29);
            uVar41 = puVar28[6];
            uVar5 = puVar28[2];
            local_74 = puVar28[1];
            uVar17 = puVar28[0x15];
            wVar18 = puVar28[0x17];
            local_164 = puVar28[0x16];
            local_184 = puVar28[0x10];
            __dest = *(undefined1 **)((long)pvVar22 + 0x1a0);
            uVar35 = *(ulong *)(puVar28 + 0xe);
            uVar42 = puVar28[7];
            uVar10 = *puVar28;
            uVar31 = puVar28[0x12];
            uVar12 = puVar28[0x11];
switchD_0011e974_default:
            do {
              local_13c = uVar12;
              local_11c = uVar31;
              uVar30 = uVar10;
              uVar44 = uVar42;
              uVar42 = uVar44;
              uVar10 = uVar30;
              uVar31 = local_11c;
              uVar12 = local_13c;
              puVar40 = __dest;
              uVar39 = uVar35;
              switch(uVar30) {
              case 0x12:
                lVar45 = 0;
                do {
                  uVar39 = uVar35 - lVar45;
                  if (uVar39 == 0) {
                    *puVar28 = 2;
                    *local_58 = bytes_avail;
                    local_58[1] = sStack_c0;
                    *(undefined8 *)(puVar28 + 0xe) = 0;
                    puVar28[8] = uVar16;
                    puVar28[7] = uVar44;
                    puVar28[0x15] = uVar17;
                    puVar28[0x16] = local_164;
                    puVar28[0x10] = local_184;
                    puVar28[0x11] = local_13c;
                    puVar28[0x12] = local_11c;
                    puVar28[6] = uVar41;
                    *(undefined1 **)((long)pvVar22 + 0x1a8) = puVar1 + (-lVar45 - (long)__dest);
                    uVar42 = 1;
                    goto LAB_0011f678;
                  }
                  puVar40 = __dest + lVar45;
                  if (puVar1 <= puVar40) {
LAB_0011f412:
                    uVar30 = 0x12;
                    goto LAB_0011f423;
                  }
                  if ((wchar_t)sStack_c0 < wVar4) {
                    wVar43 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
                    if ((wVar43 != L'\0') || (wVar4 <= (wchar_t)sStack_c0)) goto LAB_0011ea96;
                    if (sVar13 != uVar25) goto LAB_0011f412;
                    uVar14 = *(ushort *)
                              (*(long *)(puVar28 + 0x6a) +
                              (ulong)((uint)(bytes_avail << ((char)wVar4 - (char)sStack_c0 & 0x3fU))
                                     & cache_masks[wVar4]) * 2);
                    uVar39 = (ulong)uVar14;
                    if ((int)puVar28[0x52] <= (int)(uint)uVar14) {
                      uVar39 = 0;
                    }
                    iVar21 = (wchar_t)sStack_c0 - (uint)*(byte *)(local_50 + uVar39);
                    sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar21);
                    if (iVar21 < 0) goto LAB_0011f66b;
                  }
                  else {
LAB_0011ea96:
                    uVar14 = *(ushort *)
                              (*(long *)(puVar28 + 0x6a) +
                              (ulong)((uint)((ulong)bytes_avail >>
                                            ((char)(wchar_t)sStack_c0 - (char)wVar4 & 0x3fU)) &
                                     cache_masks[wVar4]) * 2);
                    uVar39 = (ulong)uVar14;
                    if ((int)puVar28[0x52] <= (int)(uint)uVar14) {
                      uVar39 = 0;
                    }
                    sStack_c0 = CONCAT44(sStack_c0._4_4_,
                                         (wchar_t)sStack_c0 - (uint)*(byte *)(local_50 + uVar39));
                  }
                  uVar42 = (uint)uVar39;
                  if (0xff < uVar42) goto LAB_0011eb14;
                  *(char *)(lVar33 + (int)uVar41) = (char)uVar39;
                  uVar41 = uVar41 + 1 & uVar5;
                  *puVar40 = (char)uVar39;
                  lVar45 = lVar45 + 1;
                } while( true );
              case 0x13:
                goto LAB_0011eb2a;
              case 0x14:
                goto LAB_0011ed16;
              case 0x15:
                uVar42 = local_184;
                goto LAB_0011f013;
              case 0x16:
                goto LAB_0011f022;
              }
            } while( true );
          }
          iVar26 = 0;
          goto LAB_0011f5e5;
        }
        archive_set_error(&a->archive,0x54,"Truncated CAB file data");
        goto LAB_0011fa1c;
      }
      if ((ulong)*(ushort *)(lVar7 + 6) == 0) {
LAB_0011f8b2:
        pvVar23 = *(void **)((long)pvVar22 + 0xa0);
        if ((10 < uVar14) &&
           (lVar33 = *(long *)((long)pvVar22 + 0x1b8), *(char *)(lVar33 + 0x28) != '\0')) {
          iVar21 = *(int *)(*(long *)((long)pvVar22 + 0x28) + 0x58);
          pvVar38 = (void *)((long)pvVar23 + ((ulong)uVar14 - 10));
          pvVar29 = pvVar23;
          while ((pvVar29 < pvVar38 &&
                 (pvVar29 = memchr(pvVar29,0xe8,(long)pvVar38 - (long)pvVar29),
                 pvVar29 != (void *)0x0))) {
            iVar32 = ((int)pvVar23 - (int)pvVar29) + iVar21 * -0x8000 + 0x8000;
            iVar37 = *(int *)((long)pvVar29 + 1);
            if ((iVar32 <= iVar37) && (iVar6 = *(int *)(lVar33 + 0x24), iVar37 < iVar6)) {
              if (iVar37 < 0) {
                iVar32 = iVar6;
              }
              *(int *)((long)pvVar29 + 1) = iVar32 + iVar37;
            }
            pvVar29 = (void *)((long)pvVar29 + 5);
          }
          pvVar23 = *(void **)((long)pvVar22 + 0xa0);
        }
        uVar14 = *(ushort *)(lVar7 + 0xe);
        *avail = (uVar25 & 0xffff) - (ulong)uVar14;
        *(short *)(lVar7 + 0xc) = (short)uVar25;
        return (void *)((long)pvVar23 + (ulong)uVar14);
      }
      pvVar23 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar7 + 6),&bytes_avail);
      if (0 < bytes_avail) {
        *(ulong *)(lVar7 + 0x10) = (ulong)*(ushort *)(lVar7 + 6);
        *(void **)(lVar7 + 0x38) = pvVar23;
        iVar26 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar7 + 6));
        if (-1 < iVar26) {
          uVar14 = *(ushort *)(lVar7 + 8);
          goto LAB_0011f8b2;
        }
        goto LAB_0011fa1c;
      }
      goto LAB_0011fa14;
    }
    uVar14 = *(ushort *)(*(long *)((long)pvVar22 + 0x28) + 8);
    puVar28 = *(undefined4 **)((long)pvVar22 + 0x1b8);
    if (puVar28 == (undefined4 *)0x0) {
      puVar28 = (undefined4 *)calloc(1,0x220);
      *(undefined4 **)((long)pvVar22 + 0x1b8) = puVar28;
      if (puVar28 != (undefined4 *)0x0) goto LAB_0011f76d;
    }
    else {
LAB_0011f76d:
      puVar28[0x87] = 0xffffffe7;
      if (0xfffffff8 < uVar14 - 0x16) {
        puVar28[0x87] = 0xffffffe2;
        iVar21 = puVar28[1];
        uVar42 = slots[uVar14 - 0xf];
        iVar37 = 1 << ((byte)uVar14 & 0x1f);
        puVar28[1] = iVar37;
        puVar28[2] = iVar37 + -1;
        if ((*(void **)(puVar28 + 4) == (void *)0x0) || (iVar21 != iVar37)) {
          free(*(void **)(puVar28 + 4));
          pvVar23 = malloc((long)(int)puVar28[1]);
          *(void **)(puVar28 + 4) = pvVar23;
          if (pvVar23 != (void *)0x0) {
            free(*(void **)(puVar28 + 0x18));
            pvVar23 = malloc((long)(int)uVar42 * 8);
            *(void **)(puVar28 + 0x18) = pvVar23;
            if (pvVar23 != (void *)0x0) goto LAB_0011f803;
          }
        }
        else {
LAB_0011f803:
          for (lVar33 = 0; lVar33 != 0x12; lVar33 = lVar33 + 1) {
            *(int *)((long)&bytes_avail + lVar33 * 4) = 1 << ((byte)lVar33 & 0x1f);
          }
          uVar35 = 0;
          if (0 < (int)uVar42) {
            uVar35 = (ulong)uVar42;
          }
          iVar21 = 0;
          uVar16 = 0;
          for (uVar39 = 0; uVar39 != uVar35; uVar39 = uVar39 + 1) {
            if (uVar16 == 0) {
              iVar21 = (int)uVar39;
LAB_0011fa9b:
              uVar16 = 0xfffffffe;
              for (iVar37 = iVar21; iVar37 != 0; iVar37 = iVar37 >> 1) {
                uVar16 = uVar16 + 1;
              }
              if ((int)uVar16 < 1) {
                uVar16 = 0;
              }
            }
            else {
              iVar21 = iVar21 + *(int *)((long)&bytes_avail + (ulong)uVar16 * 4);
              if (uVar16 < 0x11) goto LAB_0011fa9b;
            }
            lVar33 = *(long *)(puVar28 + 0x18);
            *(int *)(lVar33 + uVar39 * 8) = iVar21;
            *(uint *)(lVar33 + 4 + uVar39 * 8) = uVar16;
          }
          puVar28[6] = 0;
          *puVar28 = 0;
          *(undefined8 *)(puVar28 + 0x1a) = 0;
          puVar28[0x1c] = 0;
          puVar28[0x12] = 1;
          *(undefined8 *)(puVar28 + 0x10) = 0x100000001;
          wVar15 = lzx_huffman_init((huffman *)(puVar28 + 0x1e),8,L'\b');
          if ((((wVar15 == L'\0') &&
               (wVar15 = lzx_huffman_init((huffman *)(puVar28 + 0x6c),0x14,L'\n'), wVar15 == L'\0'))
              && (wVar15 = lzx_huffman_init((huffman *)(puVar28 + 0x52),
                                            (long)(int)(uVar42 * 8 + 0x100),L'\x10'),
                 wVar15 == L'\0')) &&
             (wVar15 = lzx_huffman_init((huffman *)(puVar28 + 0x38),0xf9,L'\x10'), wVar15 == L'\0'))
          {
            puVar28[0x87] = 0;
            *(undefined1 *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) = 1;
            goto LAB_0011e381;
          }
        }
      }
    }
    pcVar24 = "Can\'t initialize LZX decompression.";
LAB_0011fb59:
    iVar21 = -1;
  }
  else {
    if (sVar3 != 1) {
      if (sVar3 != 0) {
        archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                          *(undefined8 *)(lVar7 + 0x10));
        *avail = -0x19;
        return (void *)0x0;
      }
      lVar7 = *(long *)((long)a->format->data + 0x38);
      pvVar22 = __archive_read_ahead(a,1,avail);
      uVar25 = *avail;
      if (0 < (long)uVar25) {
        uVar35 = (ulong)*(ushort *)(lVar7 + 10);
        if (uVar35 < uVar25) {
          *avail = uVar35;
          uVar25 = uVar35;
        }
        *(undefined2 *)(lVar7 + 0xc) = *(undefined2 *)(lVar7 + 8);
        *(ulong *)(lVar7 + 0x10) = uVar25;
        *(void **)(lVar7 + 0x38) = pvVar22;
        return pvVar22;
      }
      truncated_error(a);
      *avail = -0x1e;
      return (void *)0x0;
    }
    pvVar22 = a->format->data;
    lVar7 = *(long *)((long)pvVar22 + 0x38);
    pvVar23 = *(void **)((long)pvVar22 + 0xa0);
    if (pvVar23 != (void *)0x0) {
LAB_0011e0dc:
      uVar25 = (ulong)*(ushort *)(lVar7 + 0xc);
      if (*(ushort *)(lVar7 + 0xc) == *(ushort *)(lVar7 + 8)) {
        uVar14 = *(ushort *)(lVar7 + 0xe);
        *avail = uVar25 - uVar14;
        return (void *)((long)pvVar23 + (ulong)uVar14);
      }
      if (*(char *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) == '\0') {
        *(undefined8 *)((long)pvVar22 + 0x110) = 0;
        *(undefined4 *)((long)pvVar22 + 0x118) = 0;
        *(undefined8 *)((long)pvVar22 + 0x138) = 0;
        *(undefined4 *)((long)pvVar22 + 0x130) = 0;
        *(undefined8 *)((long)pvVar22 + 0x120) = 0;
        *(undefined8 *)((long)pvVar22 + 0x128) = 0;
        if (*(char *)((long)pvVar22 + 0x180) == '\0') {
          iVar21 = inflateInit2_((long)pvVar22 + 0x110,0xfffffffffffffff1,"1.2.11",0x70);
        }
        else {
          iVar21 = inflateReset();
        }
        if (iVar21 != 0) {
          pcVar24 = "Can\'t initialize deflate decompression.";
          goto LAB_0011fb59;
        }
        *(undefined1 *)((long)pvVar22 + 0x180) = 1;
        *(undefined1 *)(*(long *)((long)pvVar22 + 0x28) + 0x5c) = 1;
      }
      uVar42 = (uint)(*(short *)(lVar7 + 6) == *(short *)(lVar7 + 4)) * 2;
      lVar33 = (long)pvVar22 + 0x110;
      *(ulong *)((long)pvVar22 + 0x138) = uVar25;
      bVar11 = false;
      while( true ) {
        uVar14 = *(ushort *)(lVar7 + 8);
        if ((bVar11) || (uVar14 <= uVar25)) break;
        *(ulong *)((long)pvVar22 + 0x128) = *(long *)((long)pvVar22 + 0xa0) + uVar25;
        *(uint *)((long)pvVar22 + 0x130) = (uint)uVar14 - (int)uVar25;
        pcVar24 = (char *)__archive_read_ahead(a,1,&bytes_avail);
        if (bytes_avail < 1) goto LAB_0011fa14;
        if ((ulong)*(ushort *)(lVar7 + 6) < (ulong)bytes_avail) {
          bytes_avail = (ulong)*(ushort *)(lVar7 + 6);
        }
        *(char **)((long)pvVar22 + 0x110) = pcVar24;
        *(int *)((long)pvVar22 + 0x118) = (int)bytes_avail;
        *(undefined8 *)((long)pvVar22 + 0x120) = 0;
        if ((int)uVar42 < 1) {
LAB_0011e325:
          bVar11 = false;
          uVar16 = inflate(lVar33,0);
          if (uVar16 != 0) {
            if (uVar16 != 1) goto LAB_0011f9ed;
            bVar11 = true;
          }
          iVar26 = *(int64_t *)((long)pvVar22 + 0x120);
          *(int64_t *)(lVar7 + 0x10) = iVar26;
          *(char **)(lVar7 + 0x38) = pcVar24;
          iVar26 = cab_minimum_consume_cfdata(a,iVar26);
          if (iVar26 < 0) goto LAB_0011fa1c;
        }
        else {
          if (bytes_avail == 0) {
LAB_0011f850:
            pcVar24 = "CFDATA incorrect(no MSZIP signature)";
            goto LAB_0011fb59;
          }
          uVar25 = (ulong)uVar42;
          if (uVar25 < (ulong)bytes_avail) {
            if (uVar42 == 2) {
              if (*pcVar24 != 'C') goto LAB_0011f850;
              cVar46 = pcVar24[1];
joined_r0x0011e2fb:
              if (cVar46 != 'K') goto LAB_0011f850;
            }
            else if (uVar42 == 1) {
              cVar46 = *pcVar24;
              goto joined_r0x0011e2fb;
            }
            *(char **)((long)pvVar22 + 0x110) = pcVar24 + uVar25;
            *(uint *)((long)pvVar22 + 0x118) = (int)bytes_avail - uVar42;
            *(ulong *)((long)pvVar22 + 0x120) = uVar25;
            uVar42 = 0;
            goto LAB_0011e325;
          }
          cVar46 = *pcVar24;
          if (uVar42 == 2) {
            if (cVar46 != 'C') goto LAB_0011f850;
            if (bytes_avail != 1) {
              cVar46 = pcVar24[1];
              goto joined_r0x0011e2c1;
            }
          }
          else {
joined_r0x0011e2c1:
            if (cVar46 != 'K') goto LAB_0011f850;
          }
          *(ssize_t *)(lVar7 + 0x10) = bytes_avail;
          *(char **)(lVar7 + 0x38) = pcVar24;
          iVar26 = cab_minimum_consume_cfdata(a,bytes_avail);
          if (iVar26 < 0) goto LAB_0011fa1c;
          uVar42 = uVar42 - (int)bytes_avail;
          bVar11 = false;
        }
        uVar25 = *(ulong *)((long)pvVar22 + 0x138);
      }
      uVar35 = uVar25 & 0xffff;
      if ((uint)uVar35 < (uint)uVar14) {
        archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar35);
        goto LAB_0011fb69;
      }
      if ((ulong)*(ushort *)(lVar7 + 6) == 0) {
LAB_0011f9b3:
        if (((int)(uint)*(ushort *)(*(long *)((long)pvVar22 + 0x28) + 4) <=
             *(int *)(*(long *)((long)pvVar22 + 0x28) + 0x58)) ||
           ((uVar16 = inflateReset(lVar33), uVar16 == 0 &&
            (uVar16 = inflateSetDictionary
                                (lVar33,*(undefined8 *)((long)pvVar22 + 0xa0),
                                 *(undefined2 *)(lVar7 + 8)), uVar16 == 0)))) {
          uVar14 = *(ushort *)(lVar7 + 0xe);
          lVar33 = *(long *)((long)pvVar22 + 0xa0);
          *avail = uVar35 - uVar14;
          *(short *)(lVar7 + 0xc) = (short)uVar25;
          return (void *)((ulong)uVar14 + lVar33);
        }
LAB_0011f9ed:
        if (uVar16 == 0xfffffffc) {
          archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
        }
        else {
          archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)",(ulong)uVar16);
        }
        *avail = -0x1e;
        return (void *)0x0;
      }
      pvVar23 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar7 + 6),&bytes_avail);
      if (0 < bytes_avail) {
        *(ulong *)(lVar7 + 0x10) = (ulong)*(ushort *)(lVar7 + 6);
        *(void **)(lVar7 + 0x38) = pvVar23;
        iVar26 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar7 + 6));
        if (-1 < iVar26) goto LAB_0011f9b3;
        goto LAB_0011fa1c;
      }
LAB_0011fa14:
      truncated_error(a);
LAB_0011fa1c:
      *avail = -0x1e;
      return (void *)0x0;
    }
    *(undefined8 *)((long)pvVar22 + 0xa8) = 0x8000;
    pvVar23 = malloc(0x8000);
    *(void **)((long)pvVar22 + 0xa0) = pvVar23;
    if (pvVar23 != (void *)0x0) goto LAB_0011e0dc;
LAB_0011f6d9:
    pcVar24 = "No memory for CAB reader";
    iVar21 = 0xc;
  }
  archive_set_error(&a->archive,iVar21,pcVar24);
LAB_0011fb69:
  *avail = -0x1e;
  return (void *)0x0;
switchD_0011e4e7_caseD_a:
  if (((piVar9[0x1c] < piVar9[0x1e] * 3) && (wVar15 = lzx_br_fillup(strm,br), wVar15 == L'\0')) &&
     (piVar9[0x1c] < piVar9[0x1e] * 3)) {
    *piVar9 = 10;
    goto joined_r0x0011f5ad;
  }
  piVar9[0x2b] = 0;
  piVar9[0x2c] = 0;
  piVar9[0x2d] = 0;
  piVar9[0x2e] = 0;
  piVar9[0x27] = 0;
  piVar9[0x28] = 0;
  piVar9[0x29] = 0;
  piVar9[0x2a] = 0;
  piVar9[0x23] = 0;
  piVar9[0x24] = 0;
  piVar9[0x25] = 0;
  piVar9[0x26] = 0;
  piVar9[0x1f] = 0;
  piVar9[0x20] = 0;
  piVar9[0x21] = 0;
  piVar9[0x22] = 0;
  piVar9[0x2f] = 0;
  for (lVar33 = 0; lVar33 < ((huffman *)(piVar9 + 0x1e))->len_size; lVar33 = lVar33 + 1) {
    *(byte *)(*(long *)(piVar9 + 0x30) + lVar33) =
         (byte)(*(ulong *)(piVar9 + 0x1a) >> ((char)piVar9[0x1c] - 3U & 0x3f)) & 7;
    piVar9[(ulong)*(byte *)(*(long *)(piVar9 + 0x30) + lVar33) + 0x1f] =
         piVar9[(ulong)*(byte *)(*(long *)(piVar9 + 0x30) + lVar33) + 0x1f] + 1;
    piVar9[0x1c] = piVar9[0x1c] + -3;
  }
  wVar15 = lzx_make_huffman_table((huffman *)(piVar9 + 0x1e));
  if (wVar15 == L'\0') goto LAB_0011f5af;
switchD_0011e4e7_caseD_b:
  piVar9[0x86] = 0;
switchD_0011e4e7_caseD_c:
  wVar15 = lzx_read_pre_tree(strm);
  if (wVar15 == L'\0') {
    *piVar9 = 0xc;
    goto joined_r0x0011f5ad;
  }
  wVar15 = lzx_make_huffman_table((huffman *)(piVar9 + 0x6c));
  if (wVar15 == L'\0') goto LAB_0011f5af;
  piVar9[0x86] = 0;
switchD_0011e4e7_caseD_d:
  wVar15 = lzx_read_bitlen(strm,(huffman *)(piVar9 + 0x52),L'Ā');
  if (wVar15 < L'\0') goto LAB_0011f5af;
  if (wVar15 == L'\0') {
    *piVar9 = 0xd;
    goto joined_r0x0011f5ad;
  }
  piVar9[0x86] = 0;
switchD_0011e4e7_caseD_e:
  wVar15 = lzx_read_pre_tree(strm);
  if (wVar15 == L'\0') {
    *piVar9 = 0xe;
    goto joined_r0x0011f5ad;
  }
  wVar15 = lzx_make_huffman_table((huffman *)(piVar9 + 0x6c));
  if (wVar15 == L'\0') goto LAB_0011f5af;
  piVar9[0x86] = 0x100;
switchD_0011e4e7_caseD_f:
  wVar15 = lzx_read_bitlen(strm,(huffman *)(piVar9 + 0x52),L'\xffffffff');
  if (wVar15 < L'\0') goto LAB_0011f5af;
  if (wVar15 == L'\0') {
    *piVar9 = 0xf;
    goto joined_r0x0011f5ad;
  }
  wVar15 = lzx_make_huffman_table((huffman *)(piVar9 + 0x52));
  if (wVar15 == L'\0') goto LAB_0011f5af;
  piVar9[0x86] = 0;
switchD_0011e4e7_caseD_10:
  wVar15 = lzx_read_pre_tree(strm);
  if (wVar15 == L'\0') {
    *piVar9 = 0x10;
    goto joined_r0x0011f5ad;
  }
  wVar15 = lzx_make_huffman_table((huffman *)(piVar9 + 0x6c));
  if (wVar15 == L'\0') goto LAB_0011f5af;
  piVar9[0x86] = 0;
switchD_0011e4e7_caseD_11:
  wVar15 = lzx_read_bitlen(strm,(huffman *)(piVar9 + 0x38),L'\xffffffff');
  if (wVar15 < L'\0') goto LAB_0011f5af;
  if (wVar15 == L'\0') {
    *piVar9 = 0x11;
    goto joined_r0x0011f5ad;
  }
  wVar15 = lzx_make_huffman_table((huffman *)(piVar9 + 0x38));
  if (wVar15 == L'\0') goto LAB_0011f5af;
  *piVar9 = 0x12;
  goto LAB_0011e4b8;
  while (iVar21 != 8) {
switchD_0011e4e7_caseD_5:
    iVar21 = piVar9[0x1c];
    if (iVar21 < 0x20) {
      if (iVar21 < 0x10) {
        iVar21 = piVar9[0x14];
        if (3 < iVar21) goto LAB_0011f254;
      }
      else {
        uVar35 = *(ulong *)(piVar9 + 0x1a) >> ((byte)(iVar21 + -0x10) & 0x3f);
        piVar9[0x1c] = iVar21 + -0x10;
        *(char *)(piVar9 + 0x13) = (char)uVar35;
        *(char *)((long)piVar9 + 0x4d) = (char)(uVar35 >> 8);
        piVar9[0x14] = 2;
        iVar21 = 2;
      }
      if (*(char *)((long)piVar9 + 0x75) != '\0') {
        piVar9[0x14] = iVar21 + 1;
        *(char *)((long)piVar9 + (long)iVar21 + 0x4c) = (char)piVar9[0x1d];
        *(undefined1 *)((long)piVar9 + 0x75) = 0;
      }
    }
    else {
      uVar35 = *(ulong *)(piVar9 + 0x1a) >> ((char)iVar21 - 0x10U & 0x3f);
      *(char *)(piVar9 + 0x13) = (char)uVar35;
      *(char *)((long)piVar9 + 0x4d) = (char)(uVar35 >> 8);
      uVar35 = *(ulong *)(piVar9 + 0x1a) >> ((byte)(iVar21 + -0x20) & 0x3f);
      piVar9[0x1c] = iVar21 + -0x20;
      *(char *)((long)piVar9 + 0x4e) = (char)uVar35;
      *(char *)((long)piVar9 + 0x4f) = (char)(uVar35 >> 8);
      piVar9[0x14] = 4;
    }
LAB_0011f254:
    while( true ) {
      iVar21 = piVar9[0x14];
      if (3 < (long)iVar21) break;
      if (*(long *)((long)pvVar22 + 400) < 1) goto joined_r0x0011f5ad;
      puVar1 = *(undefined1 **)((long)pvVar22 + 0x188);
      *(undefined1 **)((long)pvVar22 + 0x188) = puVar1 + 1;
      uVar2 = *puVar1;
      piVar9[0x14] = iVar21 + 1;
      *(undefined1 *)((long)piVar9 + (long)iVar21 + 0x4c) = uVar2;
      *(long *)((long)pvVar22 + 400) = *(long *)((long)pvVar22 + 400) + -1;
    }
    piVar9[0x14] = 0;
    iVar21 = *piVar9;
    if (iVar21 == 5) {
      iVar37 = piVar9[0x13];
      piVar9[0x10] = iVar37;
      iVar21 = 6;
LAB_0011f2c4:
      if (iVar37 < 0) goto LAB_0011f5af;
      *piVar9 = iVar21;
    }
    else {
      if (iVar21 == 6) {
        iVar37 = piVar9[0x13];
        piVar9[0x11] = iVar37;
        iVar21 = 7;
        goto LAB_0011f2c4;
      }
      if (iVar21 == 7) {
        piVar9[0x12] = piVar9[0x13];
        if (piVar9[0x13] < 0) goto LAB_0011f5af;
        *piVar9 = 8;
        break;
      }
    }
  }
switchD_0011e4e7_caseD_8:
  lVar33 = *(long *)(piVar9 + 0xe);
  while (lVar33 != 0) {
    uVar35 = *(ulong *)((long)pvVar22 + 0x1a8);
    uVar42 = 0;
    if ((long)uVar35 < 1) goto LAB_0011f5c0;
    uVar39 = *(ulong *)((long)pvVar22 + 400);
    if ((long)uVar39 < 1) {
      uVar42 = 0;
      if (sVar13 == uVar25) goto LAB_0011f5af;
      goto LAB_0011f5c0;
    }
    uVar42 = piVar9[1] - piVar9[6];
    if ((int)(uint)lVar33 <= piVar9[1] - piVar9[6]) {
      uVar42 = (uint)lVar33;
    }
    if ((long)(int)uVar42 <= (long)uVar35) {
      uVar35 = (ulong)uVar42;
    }
    if ((long)(int)uVar35 <= (long)uVar39) {
      uVar39 = uVar35 & 0xffffffff;
    }
    __n = (size_t)(int)uVar39;
    memcpy(*(void **)((long)pvVar22 + 0x1a0),*(void **)((long)pvVar22 + 0x188),__n);
    memcpy((void *)((long)piVar9[6] + *(long *)(piVar9 + 4)),*(void **)((long)pvVar22 + 0x188),__n);
    *(long *)((long)pvVar22 + 0x188) = *(long *)((long)pvVar22 + 0x188) + __n;
    *(long *)((long)pvVar22 + 400) = *(long *)((long)pvVar22 + 400) - __n;
    *(long *)((long)pvVar22 + 0x1a0) = *(long *)((long)pvVar22 + 0x1a0) + __n;
    *(long *)((long)pvVar22 + 0x1a8) = *(long *)((long)pvVar22 + 0x1a8) - __n;
    *(long *)((long)pvVar22 + 0x1b0) = *(long *)((long)pvVar22 + 0x1b0) + __n;
    piVar9[6] = piVar9[6] + (int)uVar39 & piVar9[2];
    lVar33 = *(long *)(piVar9 + 0xe) - __n;
    *(long *)(piVar9 + 0xe) = lVar33;
  }
switchD_0011e4e7_caseD_9:
  if ((*(byte *)(piVar9 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar22 + 400) < 1) {
      *piVar9 = 9;
joined_r0x0011f5ad:
      if (sVar13 == uVar25) {
LAB_0011f5af:
        piVar9[0x87] = -0x19;
        uVar42 = 0xffffffe7;
      }
      else {
        uVar42 = 0;
      }
      goto LAB_0011f5c0;
    }
    *(long *)((long)pvVar22 + 0x188) = *(long *)((long)pvVar22 + 0x188) + 1;
    *(long *)((long)pvVar22 + 400) = *(long *)((long)pvVar22 + 400) + -1;
  }
  *piVar9 = 2;
  uVar42 = 1;
  goto LAB_0011f5c0;
LAB_0011eb14:
  uVar17 = uVar42 & 7;
  local_164 = uVar42 - 0x100 >> 3;
  uVar39 = uVar35 - lVar45;
  puVar40 = __dest + lVar45;
LAB_0011eb2a:
  if (uVar17 == 7) {
    if ((wchar_t)sStack_c0 < wVar15) {
      wVar43 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar43 != L'\0') || (wVar15 <= (wchar_t)sStack_c0)) goto LAB_0011ec3e;
      if (sVar13 != uVar25) {
        uVar17 = 7;
        uVar30 = 0x13;
        goto LAB_0011f423;
      }
      uVar14 = *(ushort *)
                (*(long *)(puVar28 + 0x50) +
                (ulong)((uint)(bytes_avail << ((char)wVar15 - (char)sStack_c0 & 0x3fU)) &
                       cache_masks[wVar15]) * 2);
      uVar35 = (ulong)uVar14;
      if ((int)puVar28[0x38] <= (int)(uint)uVar14) {
        uVar35 = 0;
      }
      iVar21 = (int)uVar35;
      iVar37 = (wchar_t)sStack_c0 - (uint)*(byte *)(local_60 + uVar35);
      sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar37);
      if (iVar37 < 0) goto LAB_0011f66b;
    }
    else {
LAB_0011ec3e:
      uVar14 = *(ushort *)
                (*(long *)(puVar28 + 0x50) +
                (ulong)((uint)((ulong)bytes_avail >>
                              ((char)(wchar_t)sStack_c0 - (char)wVar15 & 0x3fU)) &
                       cache_masks[wVar15]) * 2);
      uVar35 = (ulong)uVar14;
      if ((int)puVar28[0x38] <= (int)(uint)uVar14) {
        uVar35 = 0;
      }
      iVar21 = (int)uVar35;
      sStack_c0 = CONCAT44(sStack_c0._4_4_,(wchar_t)sStack_c0 - (uint)*(byte *)(local_60 + uVar35));
    }
    uVar16 = iVar21 + 9;
  }
  else {
    uVar16 = uVar17 + 2;
  }
  if (uVar39 < (ulong)(long)(int)uVar16) goto LAB_0011f66b;
  __dest = puVar40;
  uVar35 = uVar39;
  uVar42 = local_184;
  uVar10 = 0x15;
  if (local_164 == 0) goto switchD_0011e974_default;
  if (local_164 == 2) {
    local_164 = 2;
    uVar42 = local_11c;
    uVar10 = 0x15;
    uVar31 = local_184;
    local_184 = local_11c;
    goto switchD_0011e974_default;
  }
  if (local_164 == 1) {
    local_164 = 1;
    uVar42 = local_13c;
    uVar10 = 0x15;
    uVar12 = local_184;
    local_184 = local_13c;
    goto switchD_0011e974_default;
  }
  wVar18 = *(wchar_t *)(local_68 + 4 + (long)(int)local_164 * 8);
LAB_0011ed16:
  if ((cVar46 == '\x02') && (L'\x02' < wVar18)) {
    wVar43 = wVar18 + L'\xfffffffd';
    if ((wchar_t)sStack_c0 < wVar43) {
      wVar19 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar19 == L'\0') && ((wchar_t)sStack_c0 < wVar43)) {
joined_r0x0011f665:
        uVar30 = 0x14;
        if (sVar13 == uVar25) goto LAB_0011f66b;
        goto LAB_0011f423;
      }
    }
    iVar21 = (wchar_t)sStack_c0 - wVar43;
    uVar44 = ((uint)((ulong)bytes_avail >> ((byte)iVar21 & 0x3f)) & cache_masks[(uint)wVar43]) * 8;
    wVar19 = (int)local_80 + wVar43;
    if ((wchar_t)sStack_c0 < wVar19) {
      wVar20 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar20 != L'\0') || (wVar19 <= (wchar_t)sStack_c0)) {
        iVar21 = (wchar_t)sStack_c0 - wVar43;
        goto LAB_0011ef93;
      }
      if (sVar13 != uVar25) {
        uVar30 = 0x14;
        goto LAB_0011f423;
      }
      uVar14 = *(ushort *)
                (*(long *)(puVar28 + 0x36) +
                (ulong)((uint)(bytes_avail <<
                              ((char)local_80 - (char)((wchar_t)sStack_c0 - wVar43) & 0x3fU)) &
                       cache_masks[local_80]) * 2);
      uVar35 = (ulong)uVar14;
      if ((int)puVar28[0x1e] <= (int)(uint)uVar14) {
        uVar35 = 0;
      }
      iVar21 = ((wchar_t)sStack_c0 - wVar43) - (uint)*(byte *)(local_70 + uVar35);
      sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar21);
      if (iVar21 < 0) goto LAB_0011f66b;
    }
    else {
LAB_0011ef93:
      uVar14 = *(ushort *)
                (*(long *)(puVar28 + 0x36) +
                (ulong)((uint)((ulong)bytes_avail >> ((char)iVar21 - (char)local_80 & 0x3fU)) &
                       cache_masks[local_80]) * 2);
      uVar35 = (ulong)uVar14;
      if ((int)puVar28[0x1e] <= (int)(uint)uVar14) {
        uVar35 = 0;
      }
      sStack_c0 = CONCAT44(sStack_c0._4_4_,iVar21 - (uint)*(byte *)(local_70 + uVar35));
    }
    uVar44 = (int)uVar35 + uVar44;
  }
  else {
    if ((wchar_t)sStack_c0 < wVar18) {
      wVar43 = lzx_br_fillup(strm,(lzx_br *)&bytes_avail);
      if ((wVar43 == L'\0') && ((wchar_t)sStack_c0 < wVar18)) goto joined_r0x0011f665;
    }
    uVar44 = (uint)((ulong)bytes_avail >> ((byte)((wchar_t)sStack_c0 - wVar18) & 0x3f)) &
             cache_masks[wVar18];
    sStack_c0 = CONCAT44(sStack_c0._4_4_,(wchar_t)sStack_c0 - wVar18);
  }
  uVar42 = (uVar44 + *(int *)(local_68 + (long)(int)local_164 * 8)) - 2;
  local_11c = local_13c;
  __dest = puVar40;
  uVar35 = uVar39;
  uVar44 = uVar42;
  local_13c = local_184;
LAB_0011f013:
  uVar44 = uVar41 - uVar44 & uVar5;
  local_184 = uVar42;
LAB_0011f022:
  do {
    uVar42 = uVar41;
    if ((int)uVar41 < (int)uVar44) {
      uVar42 = uVar44;
    }
    uVar31 = local_74 - uVar42;
    if ((int)uVar16 < (int)(local_74 - uVar42)) {
      uVar31 = uVar16;
    }
    if (puVar1 <= __dest + (int)uVar31) {
      uVar31 = (int)puVar1 - (int)__dest;
    }
    pvVar23 = (void *)((int)uVar44 + lVar33);
    if (((int)uVar31 < 8) ||
       (((int)uVar41 <= (int)(uVar44 + uVar31) && ((int)uVar44 <= (int)(uVar41 + uVar31))))) {
      uVar39 = 0;
      if (0 < (int)uVar31) {
        uVar39 = (ulong)uVar31;
      }
      for (uVar34 = 0; uVar39 != uVar34; uVar34 = uVar34 + 1) {
        uVar2 = *(undefined1 *)((long)pvVar23 + uVar34);
        *(undefined1 *)((int)uVar41 + lVar33 + uVar34) = uVar2;
        __dest[uVar34] = uVar2;
      }
    }
    else {
      memcpy((void *)((int)uVar41 + lVar33),pvVar23,(ulong)uVar31);
      memcpy(__dest,pvVar23,(ulong)uVar31);
    }
    puVar40 = __dest + (int)uVar31;
    uVar44 = uVar44 + uVar31 & uVar5;
    uVar41 = uVar41 + uVar31 & uVar5;
    uVar39 = uVar35 - (long)(int)uVar31;
    uVar10 = 0x16;
    if (puVar40 < puVar1) {
      uVar10 = uVar30;
    }
    iVar21 = 7;
    if (puVar40 < puVar1) {
      iVar21 = 0;
    }
    uVar12 = uVar31;
    if ((int)uVar16 <= (int)uVar31) {
      uVar10 = uVar30;
      uVar12 = 0;
    }
    uVar30 = uVar10;
    uVar42 = 10;
    if ((int)uVar16 <= (int)uVar31) {
      iVar21 = 10;
    }
    uVar16 = uVar16 - uVar12;
    __dest = puVar40;
    uVar35 = uVar39;
  } while (iVar21 == 0);
  if (iVar21 != 7) {
    if (iVar21 != 10) goto LAB_0011f678;
    uVar42 = uVar44;
    uVar10 = 0x12;
    uVar31 = local_11c;
    uVar12 = local_13c;
    goto switchD_0011e974_default;
  }
LAB_0011f423:
  *local_58 = bytes_avail;
  local_58[1] = sStack_c0;
  *(ulong *)(puVar28 + 0xe) = uVar39;
  puVar28[8] = uVar16;
  puVar28[7] = uVar44;
  puVar28[0x15] = uVar17;
  puVar28[0x17] = wVar18;
  puVar28[0x16] = local_164;
  puVar28[0x10] = local_184;
  puVar28[0x11] = local_13c;
  puVar28[0x12] = local_11c;
  *puVar28 = uVar30;
  puVar28[6] = uVar41;
  *(long *)((long)pvVar22 + 0x1a8) = (long)puVar1 - (long)puVar40;
  uVar42 = 0;
  goto LAB_0011f678;
LAB_0011f66b:
  puVar28[0x87] = 0xffffffe7;
  uVar42 = 0xffffffe7;
LAB_0011f678:
  lVar33 = local_38 - *(long *)((long)pvVar22 + 0x1a8);
  *(long *)((long)pvVar22 + 0x1a0) = *(long *)((long)pvVar22 + 0x1a0) + lVar33;
  *(long *)((long)pvVar22 + 0x1b0) = *(long *)((long)pvVar22 + 0x1b0) + lVar33;
LAB_0011f5c0:
  iVar26 = (sVar13 - *(long *)((long)pvVar22 + 400)) + *(long *)((long)pvVar22 + 0x198);
  *(int64_t *)((long)pvVar22 + 0x198) = iVar26;
  pbVar27 = local_48;
LAB_0011f5e5:
  if (1 < uVar42) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_0011fa1c;
  }
  *(int64_t *)(lVar7 + 0x10) = iVar26;
  *(byte **)(lVar7 + 0x38) = pbVar27;
  iVar26 = cab_minimum_consume_cfdata(a,iVar26);
  if (iVar26 < 0) goto LAB_0011fa1c;
  uVar25 = *(ulong *)((long)pvVar22 + 0x1b0);
  goto LAB_0011e3a6;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}